

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qurl.cpp
# Opt level: O2

void __thiscall QUrl::detach(QUrl *this)

{
  QUrlPrivate *pQVar1;
  
  if (this->d != (QUrlPrivate *)0x0) {
    qAtomicDetach<QUrlPrivate>(&this->d);
    return;
  }
  pQVar1 = (QUrlPrivate *)operator_new(0xc0);
  pQVar1->ref = (QAtomicInteger<int>)0x1;
  pQVar1->port = -1;
  memset(&pQVar1->scheme,0,0xb2);
  this->d = pQVar1;
  return;
}

Assistant:

void QUrl::detach()
{
    if (!d)
        d = new QUrlPrivate;
    else
        qAtomicDetach(d);
}